

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O0

void save_to_check_buffer_and_read_until_again
               (cio_buffered_stream *bs,void *context,cio_error err,cio_read_buffer *buffer,
               size_t num_bytes)

{
  cio_error cVar1;
  char *second_delim;
  size_t num_bytes_local;
  cio_read_buffer *buffer_local;
  cio_error err_local;
  void *context_local;
  cio_buffered_stream *bs_local;
  
  save_to_check_buffer(bs,context,err,buffer,num_bytes);
  cVar1 = cio_buffered_stream_read_until
                    (bs,buffer,(char *)context,second_dummy_read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Call to read_at_least did not succeed!",0x167,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void save_to_check_buffer_and_read_until_again(struct cio_buffered_stream *bs, void *context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	char *second_delim = context;

	save_to_check_buffer(bs, context, err, buffer, num_bytes);
	err = cio_buffered_stream_read_until(bs, buffer, second_delim, second_dummy_read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Call to read_at_least did not succeed!");
}